

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O0

ssize_t __thiscall
anon_unknown.dwarf_59e0::StreambufStream::write
          (StreambufStream *this,int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  pointer pbVar2;
  long lVar3;
  undefined4 in_register_00000034;
  streamsize nput;
  streamsize ntotal;
  StreambufStream *self;
  uint local_4;
  
  parent((ktxStream *)this);
  if ((__buf == (void *)0x0) || (__n == 0)) {
    local_4 = 0;
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"\t write: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,__n);
    poVar1 = std::operator<<(poVar1,"*");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)__buf);
    poVar1 = std::operator<<(poVar1,"B");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    pbVar2 = std::
             unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
             ::operator->((unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                           *)0x10da2c);
    lVar3 = std::streambuf::sputn((char *)pbVar2,CONCAT44(in_register_00000034,__fd));
    local_4 = 8;
    if (lVar3 == (long)__buf * __n) {
      local_4 = 0;
    }
  }
  return (ulong)local_4;
}

Assistant:

static KTX_error_code write(ktxStream* str, const void* src, ktx_size_t size, ktx_size_t count)
    {
        auto self = parent(str);
        if (size == 0 || count == 0)
        {
            return KTX_SUCCESS;
        }
        std::cerr << "\t write: " << count << "*" << size << "B" << std::endl;

        const auto ntotal = std::streamsize(size * count);
        const std::streamsize nput = self->_streambuf->sputn(reinterpret_cast<const char*>(src), ntotal);
        return (nput == ntotal) ? KTX_SUCCESS : KTX_FILE_WRITE_ERROR;
    }